

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,undefined8 *xn,xpath_allocator *alloc,
          byte once)

{
  xml_node_struct *n;
  xml_attribute_struct *a;
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node_struct *n_00;
  
  n = (xml_node_struct *)*xn;
  a = (xml_attribute_struct *)xn[1];
  if (n == (xml_node_struct *)0x0 || a != (xml_attribute_struct *)0x0) {
    if (((a != (xml_attribute_struct *)0x0) && (n != (xml_node_struct *)0x0)) &&
       (this->_test == '\x02')) {
      step_push(this,ns,a,n,alloc);
      return;
    }
  }
  else {
    bVar2 = step_push(this,ns,n,alloc);
    if ((bVar2 & once) == 0) {
      pxVar1 = n->first_child;
      while ((n_00 = pxVar1, n_00 != (xml_node_struct *)0x0 &&
             (bVar2 = step_push(this,ns,n_00,alloc), (bVar2 & once) == 0))) {
        pxVar1 = n_00->first_child;
        if (n_00->first_child == (xml_node_struct *)0x0) {
          while (pxVar1 = n_00->next_sibling, n_00->next_sibling == (xml_node_struct *)0x0) {
            n_00 = n_00->parent;
            if (n_00 == n) {
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}